

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

DesugaredObject * jsonnet::internal::makeStdlibAST(Allocator *alloc,string *filename)

{
  DesugaredObject *pDVar1;
  string *in_RSI;
  Allocator *in_RDI;
  Desugarer desugarer;
  string *in_stack_000001e8;
  Desugarer *in_stack_000001f0;
  string local_40 [32];
  Desugarer local_20 [2];
  
  Desugarer::Desugarer(local_20,in_RDI,true);
  std::__cxx11::string::string(local_40,in_RSI);
  pDVar1 = Desugarer::stdlibAST(in_stack_000001f0,in_stack_000001e8);
  std::__cxx11::string::~string(local_40);
  return pDVar1;
}

Assistant:

DesugaredObject *makeStdlibAST(Allocator *alloc, std::string filename) {
    Desugarer desugarer(alloc, true);
    return desugarer.stdlibAST(filename);
}